

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Syn3(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pNew;
  char *pcVar2;
  uint fVeryVerbose;
  uint fVerbose;
  char *pcVar3;
  
  fVerbose = 0;
  Extra_UtilGetoptReset();
  fVeryVerbose = 0;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"vwh"), iVar1 == 0x77) {
      fVeryVerbose = fVeryVerbose ^ 1;
    }
    if (iVar1 == -1) break;
    if (iVar1 != 0x76) {
      Abc_Print(-2,"usage: &syn3 [-lvh]\n");
      Abc_Print(-2,"\t         performs AIG optimization\n");
      pcVar3 = "yes";
      pcVar2 = "yes";
      if (fVerbose == 0) {
        pcVar2 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
      if (fVeryVerbose == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-w     : toggle printing additional information [default = %s]\n",pcVar3);
      pcVar2 = "\t-h     : print the command usage\n";
      iVar1 = -2;
LAB_0027f2a8:
      Abc_Print(iVar1,pcVar2);
      return 1;
    }
    fVerbose = fVerbose ^ 1;
  }
  if (pAbc->pGia != (Gia_Man_t *)0x0) {
    pNew = Gia_ManAigSyn3(pAbc->pGia,fVerbose,fVeryVerbose);
    Abc_FrameUpdateGia(pAbc,pNew);
    return 0;
  }
  pcVar2 = "Abc_CommandAbc9Syn3(): There is no AIG.\n";
  iVar1 = -1;
  goto LAB_0027f2a8;
}

Assistant:

int Abc_CommandAbc9Syn3( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int c, fVerbose = 0;
    int fVeryVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Syn3(): There is no AIG.\n" );
        return 1;
    }
    pTemp = Gia_ManAigSyn3( pAbc->pGia, fVerbose, fVeryVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &syn3 [-lvh]\n" );
    Abc_Print( -2, "\t         performs AIG optimization\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing additional information [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}